

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O0

void ht_del_hash_table(ht_hash_table *ht)

{
  ht_item *item_00;
  ostream *this;
  ht_item *item;
  int i;
  ht_hash_table *ht_local;
  
  for (item._4_4_ = 0; item._4_4_ < ht->size; item._4_4_ = item._4_4_ + 1) {
    item_00 = ht->items[item._4_4_];
    if ((item_00 != &HT_DELETED_ITEM) && (item_00 != (ht_item *)0x0)) {
      ht_del_item(item_00);
    }
  }
  free(ht->items);
  free(ht);
  this = std::operator<<((ostream *)&std::cout,"delete a hash table");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ht_del_hash_table(ht_hash_table* ht) {
    for (int i = 0; i < ht->size; i++) {
        ht_item* item = ht->items[i];
        if (item == &HT_DELETED_ITEM) {
            item = nullptr;
            // free(item);
        } else if (item != nullptr) {
            ht_del_item(item);
        }
    }
    free(ht->items);
    free(ht);
    std::cout << "delete a hash table" << std::endl;
}